

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
::increment(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  *this_local;
  
  btree_iterator_generation_info_disabled::assert_valid_generation(this->node_);
  bVar1 = btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::is_leaf(this->node_);
  if (bVar1) {
    iVar3 = this->position_ + 1;
    this->position_ = iVar3;
    bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::finish(this->node_);
    if (iVar3 < (int)(uint)bVar2) {
      return;
    }
  }
  increment_slow(this);
  return;
}

Assistant:

void increment() {
    assert_valid_generation(node_);
    if (node_->is_leaf() && ++position_ < node_->finish()) {
      return;
    }
    increment_slow();
  }